

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs5.c
# Opt level: O0

int mbedtls_pkcs5_pbkdf2_hmac
              (mbedtls_md_context_t *ctx,uchar *password,size_t plen,uchar *salt,size_t slen,
              uint iteration_count,uint32_t key_length,uchar *output)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  uint32_t local_e8;
  uchar local_e4 [4];
  uchar *puStack_e0;
  uchar counter [4];
  uchar *out_p;
  size_t use_len;
  byte local_c8 [7];
  uchar md_size;
  uchar work [64];
  uchar md1 [64];
  uint i;
  int j;
  int ret;
  uint iteration_count_local;
  size_t slen_local;
  uchar *salt_local;
  size_t plen_local;
  uchar *password_local;
  mbedtls_md_context_t *ctx_local;
  
  bVar2 = mbedtls_md_get_size(ctx->md_info);
  puStack_e0 = output;
  memset(local_e4,0,4);
  local_e4[3] = 1;
  while( true ) {
    if (key_length == 0) {
      return 0;
    }
    iVar3 = mbedtls_md_hmac_starts(ctx,password,plen);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = mbedtls_md_hmac_update(ctx,salt,slen);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = mbedtls_md_hmac_update(ctx,local_e4,4);
    if (iVar3 != 0) break;
    iVar3 = mbedtls_md_hmac_finish(ctx,local_c8);
    if (iVar3 != 0) {
      return iVar3;
    }
    memcpy(work + 0x38,local_c8,(ulong)bVar2);
    md1[0x38] = '\x01';
    md1[0x39] = '\0';
    md1[0x3a] = '\0';
    md1[0x3b] = '\0';
    for (; (uint)md1._56_4_ < iteration_count; md1._56_4_ = md1._56_4_ + 1) {
      iVar3 = mbedtls_md_hmac_starts(ctx,password,plen);
      if (iVar3 != 0) {
        return iVar3;
      }
      iVar3 = mbedtls_md_hmac_update(ctx,work + 0x38,(ulong)bVar2);
      if (iVar3 != 0) {
        return iVar3;
      }
      iVar3 = mbedtls_md_hmac_finish(ctx,work + 0x38);
      if (iVar3 != 0) {
        return iVar3;
      }
      md1[0x3c] = '\0';
      md1[0x3d] = '\0';
      md1[0x3e] = '\0';
      md1[0x3f] = '\0';
      for (; (int)md1._60_4_ < (int)(uint)bVar2; md1._60_4_ = md1._60_4_ + 1) {
        local_c8[(int)md1._60_4_] = local_c8[(int)md1._60_4_] ^ work[(long)(int)md1._60_4_ + 0x38];
      }
    }
    if (key_length < bVar2) {
      local_e8 = key_length;
    }
    else {
      local_e8 = (uint32_t)bVar2;
    }
    memcpy(puStack_e0,local_c8,(ulong)local_e8);
    key_length = key_length - local_e8;
    puStack_e0 = puStack_e0 + local_e8;
    md1[0x38] = '\x04';
    md1[0x39] = '\0';
    md1[0x3a] = '\0';
    md1[0x3b] = '\0';
    while ((md1._56_4_ != 0 &&
           (uVar1 = local_e4[md1._56_4_ - 1], local_e4[md1._56_4_ - 1] = uVar1 + '\x01',
           (uchar)(uVar1 + '\x01') == '\0'))) {
      md1._56_4_ = md1._56_4_ + -1;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_pkcs5_pbkdf2_hmac( mbedtls_md_context_t *ctx, const unsigned char *password,
                       size_t plen, const unsigned char *salt, size_t slen,
                       unsigned int iteration_count,
                       uint32_t key_length, unsigned char *output )
{
    int ret, j;
    unsigned int i;
    unsigned char md1[MBEDTLS_MD_MAX_SIZE];
    unsigned char work[MBEDTLS_MD_MAX_SIZE];
    unsigned char md_size = mbedtls_md_get_size( ctx->md_info );
    size_t use_len;
    unsigned char *out_p = output;
    unsigned char counter[4];

    memset( counter, 0, 4 );
    counter[3] = 1;

    if( iteration_count > 0xFFFFFFFF )
        return( MBEDTLS_ERR_PKCS5_BAD_INPUT_DATA );

    while( key_length )
    {
        // U1 ends up in work
        //
        if( ( ret = mbedtls_md_hmac_starts( ctx, password, plen ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_md_hmac_update( ctx, salt, slen ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_md_hmac_update( ctx, counter, 4 ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_md_hmac_finish( ctx, work ) ) != 0 )
            return( ret );

        memcpy( md1, work, md_size );

        for( i = 1; i < iteration_count; i++ )
        {
            // U2 ends up in md1
            //
            if( ( ret = mbedtls_md_hmac_starts( ctx, password, plen ) ) != 0 )
                return( ret );

            if( ( ret = mbedtls_md_hmac_update( ctx, md1, md_size ) ) != 0 )
                return( ret );

            if( ( ret = mbedtls_md_hmac_finish( ctx, md1 ) ) != 0 )
                return( ret );

            // U1 xor U2
            //
            for( j = 0; j < md_size; j++ )
                work[j] ^= md1[j];
        }

        use_len = ( key_length < md_size ) ? key_length : md_size;
        memcpy( out_p, work, use_len );

        key_length -= (uint32_t) use_len;
        out_p += use_len;

        for( i = 4; i > 0; i-- )
            if( ++counter[i - 1] != 0 )
                break;
    }

    return( 0 );
}